

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O0

void __thiscall lf::geometry::TriaO2::TriaO2(TriaO2 *this,Matrix<double,__1,_6,_0,__1,_6> *coords)

{
  double local_928;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
  local_920;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_8f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_8d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_8b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_888;
  double local_840;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_838;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_7c8;
  double local_7a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_7a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_770;
  double local_758;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_750;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_710;
  double local_690;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_688;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_658;
  double local_640;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_638;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_5f8;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_578;
  double local_558;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_550;
  double local_520;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_518;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_4e8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_478;
  double local_3f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_3e8;
  double local_3b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_3b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_380;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_310;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_288;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_268;
  ColXpr local_248;
  Matrix<double,__1,_1,_0,__1,_1> local_210;
  StorageBaseType *local_200;
  VectorXd *F;
  Matrix<double,__1,_1,_0,__1,_1> local_1c0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_1b0;
  VectorXd *E;
  Matrix<double,__1,_1,_0,__1,_1> local_170;
  StorageBaseType *local_160;
  VectorXd *D;
  Matrix<double,__1,_1,_0,__1,_1> local_120;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_110;
  VectorXd *C;
  Matrix<double,__1,_1,_0,__1,_1> local_d0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_c0;
  VectorXd *B;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_70;
  VectorXd *A;
  Index local_60;
  Index local_58;
  int local_4c;
  Index local_48;
  int local_3c;
  Index local_38 [3];
  Index local_20;
  Matrix<double,__1,_6,_0,__1,_6> *local_18;
  Matrix<double,__1,_6,_0,__1,_6> *coords_local;
  TriaO2 *this_local;
  
  local_18 = coords;
  coords_local = (Matrix<double,__1,_6,_0,__1,_6> *)this;
  Geometry::Geometry(&this->super_Geometry);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00ef9cd0;
  Eigen::Matrix<double,_-1,_6,_0,_-1,_6>::Matrix(&this->coords_,coords);
  local_20 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->alpha_,&local_20);
  local_38[0] = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::rows
                          (&(this->coords_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>);
  local_3c = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->beta_,local_38,&local_3c);
  local_48 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>);
  local_4c = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->gamma_,&local_48,&local_4c);
  local_58 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->delta_,&local_58);
  local_60 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>);
  A._4_4_ = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->gamma_x_2_,&local_60,(int *)((long)&A + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            ((ColXpr *)&B,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_80,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)&B);
  local_70 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            ((ColXpr *)&C,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_d0,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)&C);
  local_c0 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            ((ColXpr *)&D,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,2);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_120,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)&D);
  local_110 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_120;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            ((ColXpr *)&E,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,3);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_170,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)&E);
  local_160 = (StorageBaseType *)&local_170;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            ((ColXpr *)&F,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,4);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_1c0,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)&F);
  local_1b0 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>_>::col
            (&local_248,(DenseBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_> *)&this->coords_,5);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_210,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>_> *)
             &local_248);
  local_200 = (StorageBaseType *)&local_210;
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator<<
            (&local_268,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->alpha_,local_70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_268);
  local_3b8 = 4.0;
  Eigen::operator*(&local_3b0,&local_3b8,local_160);
  local_3f0 = 3.0;
  Eigen::operator*(&local_3e8,&local_3f0,(StorageBaseType *)local_70);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator-(&local_380,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_3b0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_3e8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator-(&local_310,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_380,local_c0);
  Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
            (&local_288,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->beta_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_310);
  local_520 = 4.0;
  Eigen::operator*(&local_518,&local_520,local_200);
  local_558 = 3.0;
  Eigen::operator*(&local_550,&local_558,(StorageBaseType *)local_70);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator-(&local_4e8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_518,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_550);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator-(&local_478,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_4e8,local_110);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_288,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_478);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_288);
  local_640 = 2.0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_658,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_70,local_c0);
  Eigen::operator*(&local_638,&local_640,(StorageBaseType *)&local_658);
  local_690 = 4.0;
  Eigen::operator*(&local_688,&local_690,local_160);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator-(&local_5f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_638,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_688);
  Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
            (&local_578,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->gamma_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_5f8);
  local_758 = 2.0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_770,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_70,local_110);
  Eigen::operator*(&local_750,&local_758,(StorageBaseType *)&local_770);
  local_7a8 = 4.0;
  Eigen::operator*(&local_7a0,&local_7a8,local_200);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator-(&local_710,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_750,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_7a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_578,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_710);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_578);
  local_840 = 4.0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_8d0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_70,local_1b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator-(&local_8b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_8d0,local_160);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator-(&local_888,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_8b8,local_200);
  Eigen::operator*(&local_838,&local_840,(StorageBaseType *)&local_888);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator<<
            (&local_7c8,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->delta_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_838);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_7c8);
  local_928 = 2.0;
  Eigen::operator*(&local_920,&local_928,(StorageBaseType *)&this->gamma_);
  Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
            (&local_8f0,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->gamma_x_2_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>
              *)&local_920);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_8f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_210);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_170);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_120);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
  return;
}

Assistant:

TriaO2::TriaO2(Eigen::Matrix<double, Eigen::Dynamic, 6> coords)
    : coords_(std::move(coords)),
      alpha_(coords_.rows()),
      beta_(coords_.rows(), 2),
      gamma_(coords_.rows(), 2),
      delta_(coords_.rows()),
      gamma_x_2_(coords_.rows(), 2) {
  /*
   *  2                                C
   *  | \                              | \
   *  5   4              ->            F   E
   *  |     \                          |     \
   *  0 - 3 - 1                        A - D - B
   */
  const Eigen::VectorXd& A = coords_.col(0);
  const Eigen::VectorXd& B = coords_.col(1);
  const Eigen::VectorXd& C = coords_.col(2);
  const Eigen::VectorXd& D = coords_.col(3);
  const Eigen::VectorXd& E = coords_.col(4);
  const Eigen::VectorXd& F = coords_.col(5);

  // Compute monomial coeffcients of componentwise quadratic
  // polynomial
  alpha_ << A;
  beta_ << 4. * D - 3. * A - B, 4. * F - 3. * A - C;
  gamma_ << 2. * (A + B) - 4. * D, 2. * (A + C) - 4. * F;
  delta_ << 4. * (A + E - D - F);
  // coefficient for Jacobian()
  gamma_x_2_ << 2. * gamma_;
}